

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_10ddcf::DefaultIndexFixture::DefaultIndexFixture(DefaultIndexFixture *this)

{
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_29;
  address local_28;
  DefaultIndexFixture *local_10;
  DefaultIndexFixture *this_local;
  
  local_10 = this;
  IndexFixture::IndexFixture(&this->super_IndexFixture);
  (this->super_IndexFixture).super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultIndexFixture_003d10c8;
  this_00 = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x30);
  local_28.a_ = (value_type)pstore::typed_address<pstore::index::header_block>::null();
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hamt_map(this_00,&(this->super_IndexFixture).db_,
             (typed_address<pstore::index::header_block>)local_28.a_,&local_29,&local_2a);
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>>
  ::
  unique_ptr<std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>,void>
            ((unique_ptr<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,std::default_delete<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>>
              *)&this->index_,this_00);
  return;
}

Assistant:

DefaultIndexFixture ()
                : index_{(new default_index{db_})} {}